

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O1

c_int osqp_update_rho(OSQPWorkspace *work,c_float rho_new)

{
  OSQPSettings *pOVar1;
  long lVar2;
  c_int *pcVar3;
  c_int cVar4;
  long lVar5;
  c_float cVar6;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar4 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_update_rho");
    return cVar4;
  }
  if (rho_new <= 0.0) {
    printf("ERROR in %s: ","osqp_update_rho");
    printf("rho must be positive");
    putchar(10);
    cVar4 = 1;
  }
  else {
    if (work->rho_update_from_solve == 0) {
      if (work->clear_update_time == 1) {
        work->clear_update_time = 0;
        work->info->update_time = 0.0;
      }
      osqp_tic(work->timer);
    }
    if (rho_new <= 1e-06) {
      rho_new = 1e-06;
    }
    if (1000000.0 <= rho_new) {
      rho_new = 1000000.0;
    }
    pOVar1 = work->settings;
    pOVar1->rho = rho_new;
    lVar2 = work->data->m;
    if (0 < lVar2) {
      pcVar3 = work->constr_type;
      lVar5 = 0;
      do {
        if (pcVar3[lVar5] == 1) {
          cVar6 = pOVar1->rho * 1000.0;
          work->rho_vec[lVar5] = cVar6;
LAB_001adf99:
          work->rho_inv_vec[lVar5] = 1.0 / cVar6;
        }
        else if (pcVar3[lVar5] == 0) {
          work->rho_vec[lVar5] = pOVar1->rho;
          cVar6 = pOVar1->rho;
          goto LAB_001adf99;
        }
        lVar5 = lVar5 + 1;
      } while (lVar2 != lVar5);
    }
    cVar4 = (*work->linsys_solver->update_rho_vec)(work->linsys_solver,work->rho_vec);
    if (work->rho_update_from_solve == 0) {
      cVar6 = osqp_toc(work->timer);
      work->info->update_time = cVar6 + work->info->update_time;
    }
  }
  return cVar4;
}

Assistant:

c_int osqp_update_rho(OSQPWorkspace *work, c_float rho_new) {
  c_int exitflag, i;

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check value of rho
  if (rho_new <= 0) {
# ifdef PRINTING
    c_eprint("rho must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

#ifdef PROFILING
  if (work->rho_update_from_solve == 0) {
    if (work->clear_update_time == 1) {
      work->clear_update_time = 0;
      work->info->update_time = 0.0;
    }
    osqp_tic(work->timer); // Start timer
  }
#endif /* ifdef PROFILING */

  // Update rho in settings
  work->settings->rho = c_min(c_max(rho_new, RHO_MIN), RHO_MAX);

  // Update rho_vec and rho_inv_vec
  for (i = 0; i < work->data->m; i++) {
    if (work->constr_type[i] == 0) {
      // Inequalities
      work->rho_vec[i]     = work->settings->rho;
      work->rho_inv_vec[i] = 1. / work->settings->rho;
    }
    else if (work->constr_type[i] == 1) {
      // Equalities
      work->rho_vec[i]     = RHO_EQ_OVER_RHO_INEQ * work->settings->rho;
      work->rho_inv_vec[i] = 1. / work->rho_vec[i];
    }
  }

  // Update rho_vec in KKT matrix
  exitflag = work->linsys_solver->update_rho_vec(work->linsys_solver,
                                                 work->rho_vec);

#ifdef PROFILING
  if (work->rho_update_from_solve == 0)
    work->info->update_time += osqp_toc(work->timer);
#endif /* ifdef PROFILING */

  return exitflag;
}